

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O3

bool __thiscall
duckdb::Binder::TryFindBinding
          (Binder *this,string *using_column,string *join_side,BindingAlias *result)

{
  Binding *this_00;
  string *column_name;
  bool bVar1;
  BinderException *this_01;
  pointer prVar2;
  pointer prVar3;
  pointer prVar4;
  string error;
  vector<std::reference_wrapper<duckdb::Binding>,_true> bindings;
  string local_a8;
  string *local_88;
  string local_80;
  string *local_60;
  BindContext *local_58;
  pointer local_50;
  vector<std::reference_wrapper<duckdb::Binding>,_true> local_48;
  
  BindContext::GetMatchingBindings(&local_48,&this->bind_context,using_column);
  prVar3 = local_48.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  prVar4 = local_48.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_50 = local_48.
               super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    prVar2 = local_48.
             super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = using_column;
    local_60 = join_side;
    local_58 = &this->bind_context;
    do {
      bVar1 = BindingAlias::IsSet(result);
      if (bVar1) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Column name \"","");
        ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)(local_88->_M_dataplus)._M_p);
        ::std::__cxx11::string::append((char *)&local_80);
        ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)(local_60->_M_dataplus)._M_p);
        ::std::__cxx11::string::append((char *)&local_80);
        column_name = local_88;
        if (local_48.
            super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          prVar3 = local_48.
                   super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            this_00 = prVar3->_M_data;
            ::std::__cxx11::string::append((char *)&local_80);
            Binding::GetAlias_abi_cxx11_(&local_a8,this_00);
            ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            ::std::__cxx11::string::append((char *)&local_80);
            BindContext::GetActualColumnName(&local_a8,local_58,this_00,column_name);
            ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            prVar3 = prVar3 + 1;
          } while (prVar3 != local_48.
                             super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        BinderException::BinderException(this_01,&local_80);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::_M_assign((string *)result);
      ::std::__cxx11::string::_M_assign((string *)&result->schema);
      ::std::__cxx11::string::_M_assign((string *)&result->alias);
      prVar2 = prVar2 + 1;
      prVar4 = local_50;
    } while (prVar2 != prVar3);
  }
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return prVar4 != prVar3;
}

Assistant:

bool Binder::TryFindBinding(const string &using_column, const string &join_side, BindingAlias &result) {
	// for each using column, get the matching binding
	auto bindings = bind_context.GetMatchingBindings(using_column);
	if (bindings.empty()) {
		return false;
	}
	// find the join binding
	for (auto &binding : bindings) {
		if (result.IsSet()) {
			string error = "Column name \"";
			error += using_column;
			error += "\" is ambiguous: it exists more than once on ";
			error += join_side;
			error += " side of join.\nCandidates:";
			for (auto &binding_ref : bindings) {
				auto &other_binding = binding_ref.get();
				error += "\n\t";
				error += other_binding.GetAlias();
				error += ".";
				error += bind_context.GetActualColumnName(other_binding, using_column);
			}
			throw BinderException(error);
		} else {
			result = binding.get().alias;
		}
	}
	return true;
}